

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O2

void gravity_math_free(void)

{
  gravity_class_t *c;
  
  if ((gravity_class_math != (gravity_class_t *)0x0) && (refcount = refcount - 1, refcount == 0)) {
    c = gravity_class_get_meta(gravity_class_math);
    computed_property_free(c,"PI",true);
    computed_property_free(c,"E",true);
    computed_property_free(c,"LN2",true);
    computed_property_free(c,"LN10",true);
    computed_property_free(c,"LOG2E",true);
    computed_property_free(c,"LOG10E",true);
    computed_property_free(c,"SQRT2",true);
    computed_property_free(c,"SQRT1_2",true);
    gravity_class_free_core((gravity_vm *)0x0,c);
    gravity_class_free_core((gravity_vm *)0x0,gravity_class_math);
    gravity_class_math = (gravity_class_t *)0x0;
    return;
  }
  return;
}

Assistant:

void gravity_math_free (void) {
    if (!gravity_class_math) return;
    if (--refcount) return;

    gravity_class_t *meta = gravity_class_get_meta(gravity_class_math);
    computed_property_free(meta, "PI", true);
    computed_property_free(meta, "E", true);
    computed_property_free(meta, "LN2", true);
    computed_property_free(meta, "LN10", true);
    computed_property_free(meta, "LOG2E", true);
    computed_property_free(meta, "LOG10E", true);
    computed_property_free(meta, "SQRT2", true);
    computed_property_free(meta, "SQRT1_2", true);
    gravity_class_free_core(NULL, meta);
    gravity_class_free_core(NULL, gravity_class_math);

    gravity_class_math = NULL;
}